

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_memory.c
# Opt level: O2

int mpt_stream_memory(mpt_stream *stream,iovec *in,iovec *out)

{
  void *pvVar1;
  size_t sVar2;
  int *piVar3;
  void *pvVar4;
  int iVar5;
  
  if (in == (iovec *)0x0 && out == (iovec *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    return -1;
  }
  _mpt_stream_setfile(&stream->_info,-1,-1);
  mpt_stream_setmode(stream,0);
  if (out == (iovec *)0x0) {
    if (in == (iovec *)0x0) {
      return 0;
    }
    pvVar4 = in->iov_base;
    iVar5 = 0;
LAB_001073e2:
    (stream->_rd).data.base = pvVar4;
    sVar2 = in->iov_len;
    (stream->_rd).data.len = sVar2;
    (stream->_rd).data.max = sVar2;
  }
  else {
    pvVar1 = out->iov_base;
    (stream->_wd).data.base = pvVar1;
    sVar2 = out->iov_len;
    (stream->_wd).data.max = sVar2;
    if (in == (iovec *)0x0) {
      return 1;
    }
    if (in != out) {
      pvVar4 = in->iov_base;
      iVar5 = 1;
      if ((pvVar4 != pvVar1) || (in->iov_len != sVar2)) goto LAB_001073e2;
    }
    *(byte *)&(stream->_info)._fd = (byte)(stream->_info)._fd | 2;
    iVar5 = 2;
  }
  return iVar5;
}

Assistant:

extern int mpt_stream_memory(MPT_STRUCT(stream) *stream, const struct iovec *in, const struct iovec *out)
{
	int mode = 0;
	
	if (!in && !out) {
		errno = EINVAL;
		return -1;
	}
	_mpt_stream_setfile(&stream->_info, -1, -1);
	mpt_stream_setmode(stream, 0);
	
	if (out) {
		stream->_wd.data.base = out->iov_base;
		stream->_wd.data.max  = out->iov_len;
		if (!in) {
			return MPT_STREAMFLAG(Write);
		}
		if (in == out
		    || ((in->iov_base == out->iov_base) && (in->iov_len == out->iov_len))) {
			stream->_info._fd |= MPT_STREAMFLAG(RdWr);
			return MPT_STREAMFLAG(RdWr);
		}
		mode |= MPT_STREAMFLAG(Write);
	}
	if (in) {
		stream->_rd.data.base = in->iov_base;
		stream->_rd.data.max  = stream->_rd.data.len = in->iov_len;
		mode |= MPT_STREAMFLAG(Read);
	}
	return mode;
}